

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_sync_client_tthriftclient_impl(t_rs_generator *this,string *client_impl_name)

{
  ostream *poVar1;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  string *local_18;
  string *client_impl_name_local;
  t_rs_generator *this_local;
  
  local_18 = client_impl_name;
  client_impl_name_local = (string *)this;
  t_generator::indent_abi_cxx11_(&local_38,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"impl ");
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," TThriftClient for ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUNDS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_68,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_68);
  poVar1 = std::operator<<(poVar1,
                           "fn i_prot_mut(&mut self) -> &mut dyn TInputProtocol { &mut self._i_prot }"
                          );
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_68);
  t_generator::indent_abi_cxx11_(&local_88,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_88);
  poVar1 = std::operator<<(poVar1,
                           "fn o_prot_mut(&mut self) -> &mut dyn TOutputProtocol { &mut self._o_prot }"
                          );
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_88);
  t_generator::indent_abi_cxx11_(&local_a8,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_a8);
  poVar1 = std::operator<<(poVar1,"fn sequence_number(&self) -> i32 { self._sequence_number }");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a8);
  t_generator::indent_abi_cxx11_(&local_c8,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_c8);
  poVar1 = std::operator<<(poVar1,
                           "fn increment_sequence_number(&mut self) -> i32 { self._sequence_number += 1; self._sequence_number }"
                          );
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c8);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_e8,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_e8);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e8);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rs_generator::render_sync_client_tthriftclient_impl(const string &client_impl_name) {
  f_gen_
    << indent()
    << "impl "
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " TThriftClient for "
    << client_impl_name
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << SYNC_CLIENT_GENERIC_BOUNDS
    << " {" << endl;
  indent_up();

  f_gen_ << indent() << "fn i_prot_mut(&mut self) -> &mut dyn TInputProtocol { &mut self._i_prot }" << endl;
  f_gen_ << indent() << "fn o_prot_mut(&mut self) -> &mut dyn TOutputProtocol { &mut self._o_prot }" << endl;
  f_gen_ << indent() << "fn sequence_number(&self) -> i32 { self._sequence_number }" << endl;
  f_gen_
    << indent()
    << "fn increment_sequence_number(&mut self) -> i32 { self._sequence_number += 1; self._sequence_number }"
    << endl;

  indent_down();
  f_gen_ << indent() << "}" << endl;
  f_gen_ << endl;
}